

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool re2::AddQ(Instq *q,int id)

{
  bool bVar1;
  int id_local;
  Instq *q_local;
  
  if (id == 0) {
    q_local._7_1_ = true;
  }
  else {
    bVar1 = SparseSet::contains(q,id);
    if (bVar1) {
      q_local._7_1_ = false;
    }
    else {
      SparseSet::insert(q,id);
      q_local._7_1_ = true;
    }
  }
  return q_local._7_1_;
}

Assistant:

static bool AddQ(Instq *q, int id) {
  if (id == 0)
    return true;
  if (q->contains(id))
    return false;
  q->insert(id);
  return true;
}